

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

uint32_t memory_tree_ns::compute_hamming_loss_via_oas
                   (memory_tree *b,single_learner *base,uint32_t cn,example *ec,
                   v_array<unsigned_int> *selected_labs)

{
  uint64_t *puVar1;
  float fVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  label_t lVar5;
  size_t sVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  size_t sVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> leaf_labs;
  v_array<unsigned_int> local_58;
  
  if (selected_labs->_begin != (uint *)0x0) {
    free(selected_labs->_begin);
  }
  selected_labs->_begin = (uint *)0x0;
  selected_labs->_end = (uint *)0x0;
  selected_labs->end_array = (uint *)0x0;
  local_58.end_array = (uint *)0x0;
  local_58.erase_count = 0;
  local_58._begin = (uint *)0x0;
  local_58._end = (uint *)0x0;
  collect_labels_from_leaf(b,cn,&local_58);
  lVar5 = (ec->l).multi;
  pwVar3 = (ec->l).cs.costs._end;
  pwVar4 = (ec->l).cs.costs.end_array;
  sVar6 = (ec->l).cs.costs.erase_count;
  pfVar7 = (ec->pred).scalars._begin;
  pfVar8 = (ec->pred).scalars._end;
  pfVar9 = (ec->pred).scalars.end_array;
  sVar10 = (ec->pred).scalars.erase_count;
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  if (local_58._end != local_58._begin) {
    lVar16 = 0;
    uVar12 = 0;
    do {
      iVar11 = (int)b->max_routers + local_58._begin[uVar12] + 1;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar11);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar11 * *(int *)(base + 0xe0));
      if (0.0 < (ec->pred).scalar) {
        v_array<unsigned_int>::push_back(selected_labs,(uint *)((long)local_58._begin + lVar16));
      }
      uVar12 = uVar12 + 1;
      lVar16 = lVar16 + 4;
    } while (uVar12 < (ulong)((long)local_58._end - (long)local_58._begin >> 2));
  }
  (ec->pred).scalars.end_array = pfVar9;
  (ec->pred).scalars.erase_count = sVar10;
  (ec->pred).scalars._begin = pfVar7;
  (ec->pred).scalars._end = pfVar8;
  (ec->l).cs.costs.end_array = pwVar4;
  (ec->l).cs.costs.erase_count = sVar6;
  (ec->l).multi = lVar5;
  (ec->l).cs.costs._end = pwVar3;
  pwVar3 = (ec->l).cs.costs._begin;
  qsort(pwVar3,(long)(ec->l).cs.costs._end - (long)pwVar3 >> 2,4,compare_label);
  qsort(selected_labs->_begin,(long)selected_labs->_end - (long)selected_labs->_begin >> 2,4,
        compare_label);
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  uVar12 = (long)pwVar4 - (long)pwVar3 >> 2;
  if (pwVar4 == pwVar3) {
    iVar11 = 0;
  }
  else {
    uVar15 = 0;
    iVar11 = 0;
    uVar13 = 0;
    uVar14 = 0;
    do {
      if ((ulong)((long)selected_labs->_end - (long)selected_labs->_begin >> 2) <= (ulong)uVar14)
      break;
      fVar2 = (float)selected_labs->_begin[uVar14];
      if ((uint)(&pwVar3->x)[uVar15] < (uint)fVar2) {
        uVar13 = uVar13 + 1;
      }
      else {
        if ((uint)(&pwVar3->x)[uVar15] <= (uint)fVar2) {
          iVar11 = iVar11 + 1;
          uVar13 = uVar13 + 1;
        }
        uVar14 = uVar14 + 1;
      }
      uVar15 = (ulong)uVar13;
    } while (uVar15 < uVar12);
    iVar11 = iVar11 * 2;
  }
  return ((int)uVar12 + (int)((ulong)((long)selected_labs->_end - (long)selected_labs->_begin) >> 2)
         ) - iVar11;
}

Assistant:

inline uint32_t compute_hamming_loss_via_oas(memory_tree& b, single_learner& base, 
		    const uint32_t cn, example& ec, v_array<uint32_t>& selected_labs)
    {
	    selected_labs.delete_v();
    	v_array<uint32_t> leaf_labs = v_init<uint32_t>();
	    collect_labels_from_leaf(b, cn, leaf_labs); //unique labels stored in the leaf.
	    MULTILABEL::labels multilabels = ec.l.multilabels;
	    MULTILABEL::labels preds = ec.pred.multilabels;
	    ec.l.simple = {FLT_MAX, 1.f, 0.f};
	    for (size_t i = 0; i < leaf_labs.size(); i++){
		    base.predict(ec, b.max_routers + 1 + leaf_labs[i]);
		    float score = ec.pred.scalar;
		    if (score > 0)
			    selected_labs.push_back(leaf_labs[i]);
	    }
	    ec.pred.multilabels = preds;
	    ec.l.multilabels = multilabels;

	    return hamming_loss(ec.l.multilabels.label_v, selected_labs);
    }